

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

void LZ4_decompress_fast_extDict_cold_1(void)

{
  uint uVar1;
  undefined8 *in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  *(undefined1 *)in_RDI = *in_RSI;
  *(undefined1 *)((long)in_RDI + 1) = in_RSI[1];
  *(undefined1 *)((long)in_RDI + 2) = in_RSI[2];
  *(undefined1 *)((long)in_RDI + 3) = in_RSI[3];
  uVar1 = inc32table[in_RDX];
  in_RDI[1] = *(undefined4 *)(in_RSI + uVar1);
  *in_RCX = in_RSI + ((ulong)uVar1 - (long)dec64table[in_RDX]);
  return;
}

Assistant:

static void LZ4_write32(void* memPtr, U32 value) { ((unalign*)memPtr)->u32 = value; }